

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::Statement::Statement(Statement *this,CodeLocation *l)

{
  SourceCodeText *pSVar1;
  RefCountedPtr<soul::SourceCodeText> local_18;
  char *local_10;
  
  pSVar1 = (l->sourceCode).object;
  local_10 = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_002fb7e8;
  (this->super_Object).location.sourceCode.object = pSVar1;
  local_18.object = (SourceCodeText *)0x0;
  (this->super_Object).location.location.data = local_10;
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_002fc3b8;
  this->nextObject = (Statement *)0x0;
  return;
}

Assistant:

Statement (CodeLocation l) : Object (std::move (l)) {}